

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgm_overlay.cpp
# Opt level: O2

Code * __thiscall r_exec::PGMOverlay::get_mk_rdx(PGMOverlay *this,uint16_t *extent_index)

{
  int iVar1;
  int iVar2;
  Code *this_00;
  Mem *mem;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  ulong uVar3;
  Atom local_34 [4];
  
  *extent_index = 5;
  this_00 = (Code *)operator_new(0x150);
  mem = (Mem *)r_code::Mem::Get();
  LObject::LObject((LObject *)this_00,mem);
  r_code::Atom::Marker((ushort)local_34,(uchar)Opcodes::MkRdx);
  iVar1 = (*(((Object<r_code::LObject,_r_exec::LObject> *)&this_00->super__Object)->super_LObject).
            super_Code.super__Object._vptr__Object[4])(this_00,0);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var,iVar1),local_34);
  r_code::Atom::~Atom(local_34);
  r_code::Atom::RPointer((ushort)local_34);
  iVar1 = (*(((Object<r_code::LObject,_r_exec::LObject> *)&this_00->super__Object)->super_LObject).
            super_Code.super__Object._vptr__Object[4])(this_00,1);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_00,iVar1),local_34);
  r_code::Atom::~Atom(local_34);
  (*(((Object<r_code::LObject,_r_exec::LObject> *)&this_00->super__Object)->super_LObject).
    super_Code.super__Object._vptr__Object[0x19])
            (this_00,(((this->super_InputLessPGMOverlay).super_Overlay.controller)->view->object).
                     object);
  r_code::Atom::IPointer((ushort)local_34);
  iVar1 = (*(((Object<r_code::LObject,_r_exec::LObject> *)&this_00->super__Object)->super_LObject).
            super_Code.super__Object._vptr__Object[4])(this_00,2);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_01,iVar1),local_34);
  r_code::Atom::~Atom(local_34);
  r_code::Atom::Set((uchar)local_34);
  *extent_index = *extent_index + 1;
  iVar1 = (*(((Object<r_code::LObject,_r_exec::LObject> *)&this_00->super__Object)->super_LObject).
            super_Code.super__Object._vptr__Object[4])(this_00);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_02,iVar1),local_34);
  r_code::Atom::~Atom(local_34);
  for (iVar1 = 1; uVar3 = (ulong)(iVar1 - 1U & 0xffff),
      uVar3 < (ulong)((long)(this->input_views).
                            super__Vector_base<core::P<r_code::View>,_std::allocator<core::P<r_code::View>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->input_views).
                            super__Vector_base<core::P<r_code::View>,_std::allocator<core::P<r_code::View>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3); iVar1 = iVar1 + 1) {
    r_code::Atom::RPointer((ushort)local_34);
    *extent_index = *extent_index + 1;
    iVar2 = (*(((Object<r_code::LObject,_r_exec::LObject> *)&this_00->super__Object)->super_LObject)
              .super_Code.super__Object._vptr__Object[4])(this_00);
    r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_03,iVar2),local_34);
    r_code::Atom::~Atom(local_34);
    (*(((Object<r_code::LObject,_r_exec::LObject> *)&this_00->super__Object)->super_LObject).
      super_Code.super__Object._vptr__Object[0x19])
              (this_00,(this->input_views).
                       super__Vector_base<core::P<r_code::View>,_std::allocator<core::P<r_code::View>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar3].object[2]._vptr__Object);
  }
  r_code::Atom::IPointer((ushort)local_34);
  iVar1 = (*(((Object<r_code::LObject,_r_exec::LObject> *)&this_00->super__Object)->super_LObject).
            super_Code.super__Object._vptr__Object[4])(this_00,3);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_04,iVar1),local_34);
  r_code::Atom::~Atom(local_34);
  r_code::Atom::Float(1.0);
  iVar1 = (*(((Object<r_code::LObject,_r_exec::LObject> *)&this_00->super__Object)->super_LObject).
            super_Code.super__Object._vptr__Object[4])(this_00,4);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_05,iVar1),local_34);
  r_code::Atom::~Atom(local_34);
  return this_00;
}

Assistant:

Code *PGMOverlay::get_mk_rdx(uint16_t &extent_index) const
{
    uint16_t write_index = 0;
    extent_index = MK_RDX_ARITY + 1;
    Code *mk_rdx = new r_exec::LObject(_Mem::Get());
    mk_rdx->code(write_index++) = Atom::Marker(Opcodes::MkRdx, MK_RDX_ARITY);
    mk_rdx->code(write_index++) = Atom::RPointer(0); // code.
    mk_rdx->add_reference(getObject());
    mk_rdx->code(write_index++) = Atom::IPointer(extent_index); // inputs.
    mk_rdx->code(extent_index++) = Atom::Set(input_views.size());

    for (uint16_t i = 0; i < input_views.size(); ++i) {
        mk_rdx->code(extent_index++) = Atom::RPointer(i + 1);
        mk_rdx->add_reference(input_views[i]->object);
    }

    mk_rdx->code(write_index++) = Atom::IPointer(extent_index); // productions.
    mk_rdx->code(write_index++) = Atom::Float(1); // psln_thr.
    return mk_rdx;
}